

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.cpp
# Opt level: O1

void __thiscall
slang::analysis::CaseDecisionDag::CaseDecisionDag
          (CaseDecisionDag *this,span<const_slang::SVInt,_18446744073709551615UL> clauses,
          uint32_t bitWidth,bool wildcardX,uint32_t maxSteps)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  SVInt curPath;
  group_type_pointer pgVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  __extent_storage<18446744073709551615UL> __n;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  value_type_pointer puVar18;
  value_type_pointer ppVar19;
  value_type_pointer ppVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  value_type_conflict3 *elements_2;
  value_type_conflict3 *elements_3;
  uint uVar24;
  uchar uVar25;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  int iVar30;
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *activeIndicesInput;
  value_type_pointer local_b0;
  ClauseIndex index;
  SVInt start;
  void *local_90;
  uint local_88;
  byte local_83;
  group_type_pointer local_80;
  size_t local_78;
  size_t local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> activeIndices;
  locator res;
  
  __n = clauses._M_extent._M_extent_value;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_index = 0x3f;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_mask = 1;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  puVar18 = (this->unreachableClauses).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            .arrays.elements_;
  sVar15 = 0x1d;
  if (puVar18 != (value_type_pointer)0x0) {
    puVar18 = (value_type_pointer)0x1d;
  }
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.ml = (size_t)puVar18;
  (this->unreachableClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.size = 0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_size_mask = 1;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar19 = (this->overlappingClauses).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            .arrays.elements_;
  if (ppVar19 != (value_type_pointer)0x0) {
    ppVar19 = (value_type_pointer)0x1d;
  }
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.ml = (size_t)ppVar19;
  (this->overlappingClauses).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  .size_ctrl.size = 0;
  (this->counterexample).super__Optional_base<slang::SVInt,_false,_false>._M_payload.
  super__Optional_payload<slang::SVInt,_true,_false,_false>.
  super__Optional_payload_base<slang::SVInt>._M_engaged = false;
  this->gaveUp = false;
  this->steps = 0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar20 = (this->visitedKeys).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
            .arrays.elements_;
  if (ppVar20 != (value_type_pointer)0x0) {
    ppVar20 = (value_type_pointer)0x1d;
  }
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .size_ctrl.ml = (size_t)ppVar20;
  (this->visitedKeys).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
  .size_ctrl.size = 0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_index = 0x3f;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_size_mask = 1;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->usedIndices).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar15 = 0;
  }
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.ml = sVar15;
  (this->usedIndices).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  .size_ctrl.size = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&activeIndices,__n._M_extent_value,(allocator_type *)&res);
  auVar32 = _DAT_004abef0;
  auVar31 = _DAT_004abee0;
  auVar9 = _DAT_0048e4e0;
  if (activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar14 = (long)activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (-4 - (long)activeIndices.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    auVar37._8_4_ = (int)uVar14;
    auVar37._0_8_ = uVar14;
    auVar37._12_4_ = (int)(uVar14 >> 0x20);
    auVar26._0_8_ = uVar14 >> 2;
    auVar26._8_8_ = auVar37._8_8_ >> 2;
    uVar16 = 0;
    auVar26 = auVar26 ^ _DAT_0048e4e0;
    do {
      uVar17 = (uint)uVar16;
      auVar36._8_4_ = uVar17;
      auVar36._0_8_ = uVar16;
      auVar36._12_4_ = (int)(uVar16 >> 0x20);
      auVar37 = (auVar36 | auVar32) ^ auVar9;
      iVar30 = auVar26._4_4_;
      if ((bool)(~(auVar37._4_4_ == iVar30 && auVar26._0_4_ < auVar37._0_4_ ||
                  iVar30 < auVar37._4_4_) & 1)) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16] = uVar17;
      }
      if ((auVar37._12_4_ != auVar26._12_4_ || auVar37._8_4_ <= auVar26._8_4_) &&
          auVar37._12_4_ <= auVar26._12_4_) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16 + 1] = uVar17 + 1;
      }
      auVar37 = (auVar36 | auVar31) ^ auVar9;
      iVar38 = auVar37._4_4_;
      if (iVar38 <= iVar30 && (iVar38 != iVar30 || auVar37._0_4_ <= auVar26._0_4_)) {
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16 + 2] = uVar17 + 2;
        activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16 + 3] = uVar17 + 3;
      }
      uVar16 = uVar16 + 4;
    } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar16);
  }
  SVInt::SVInt(&start,bitWidth,0,false);
  activeIndicesInput = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x44b8f1;
  SVInt::SVInt((SVInt *)&local_90,&start.super_SVIntStorage);
  curPath.super_SVIntStorage._8_8_ = &activeIndices;
  curPath.super_SVIntStorage.field_0.pVal = (uint64_t *)&local_90;
  build(this,0,clauses,bitWidth,wildcardX,maxSteps,curPath,activeIndicesInput);
  if (((0x40 < local_88) || ((local_83 & 1) != 0)) && (local_90 != (void *)0x0)) {
    operator_delete__(local_90);
  }
  if (this->steps < maxSteps) {
    if (__n._M_extent_value != 0) {
      uVar14 = 0;
      do {
        index = (ClauseIndex)uVar14;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar14 & 0xffffffff;
        uVar21 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar11 = uVar21 >> ((byte)(this->usedIndices).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  .arrays.groups_size_index & 0x3f);
        pgVar4 = (this->usedIndices).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar21 & 0xff];
        puVar18 = (this->usedIndices).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  .arrays.elements_;
        uVar16 = (this->usedIndices).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_size_mask;
        uVar22 = 0;
        do {
          pgVar2 = pgVar4 + uVar11;
          uVar25 = (uchar)uVar3;
          auVar31[0] = -(pgVar2->m[0].n == uVar25);
          uVar27 = (uchar)((uint)uVar3 >> 8);
          auVar31[1] = -(pgVar2->m[1].n == uVar27);
          uVar28 = (uchar)((uint)uVar3 >> 0x10);
          auVar31[2] = -(pgVar2->m[2].n == uVar28);
          uVar29 = (uchar)((uint)uVar3 >> 0x18);
          auVar31[3] = -(pgVar2->m[3].n == uVar29);
          auVar31[4] = -(pgVar2->m[4].n == uVar25);
          auVar31[5] = -(pgVar2->m[5].n == uVar27);
          auVar31[6] = -(pgVar2->m[6].n == uVar28);
          auVar31[7] = -(pgVar2->m[7].n == uVar29);
          auVar31[8] = -(pgVar2->m[8].n == uVar25);
          auVar31[9] = -(pgVar2->m[9].n == uVar27);
          auVar31[10] = -(pgVar2->m[10].n == uVar28);
          auVar31[0xb] = -(pgVar2->m[0xb].n == uVar29);
          auVar31[0xc] = -(pgVar2->m[0xc].n == uVar25);
          auVar31[0xd] = -(pgVar2->m[0xd].n == uVar27);
          auVar31[0xe] = -(pgVar2->m[0xe].n == uVar28);
          auVar31[0xf] = -(pgVar2->m[0xf].n == uVar29);
          for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe); uVar17 != 0;
              uVar17 = uVar17 - 1 & uVar17) {
            uVar7 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (puVar18[uVar11 * 0xf + (ulong)uVar7] == index) {
              puVar18 = puVar18 + uVar11 * 0xf + (ulong)uVar7;
              goto LAB_0044ba3c;
            }
          }
          if ((pgVar4[uVar11].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) {
            puVar18 = (value_type_pointer)0x0;
            goto LAB_0044ba3c;
          }
          lVar12 = uVar11 + uVar22;
          uVar22 = uVar22 + 1;
          uVar11 = lVar12 + 1U & uVar16;
        } while (uVar22 <= uVar16);
        puVar18 = (value_type_pointer)0x0;
LAB_0044ba3c:
        if (puVar18 == (value_type_pointer)0x0) {
          uVar22 = uVar21 >> ((byte)(this->unreachableClauses).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                    .arrays.groups_size_index & 0x3f);
          pgVar4 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_;
          puVar18 = (this->unreachableClauses).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    .arrays.elements_;
          uVar16 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_size_mask;
          uVar23 = 0;
          uVar11 = uVar22;
          do {
            pgVar2 = pgVar4 + uVar11;
            auVar32[0] = -(pgVar2->m[0].n == uVar25);
            auVar32[1] = -(pgVar2->m[1].n == uVar27);
            auVar32[2] = -(pgVar2->m[2].n == uVar28);
            auVar32[3] = -(pgVar2->m[3].n == uVar29);
            auVar32[4] = -(pgVar2->m[4].n == uVar25);
            auVar32[5] = -(pgVar2->m[5].n == uVar27);
            auVar32[6] = -(pgVar2->m[6].n == uVar28);
            auVar32[7] = -(pgVar2->m[7].n == uVar29);
            auVar32[8] = -(pgVar2->m[8].n == uVar25);
            auVar32[9] = -(pgVar2->m[9].n == uVar27);
            auVar32[10] = -(pgVar2->m[10].n == uVar28);
            auVar32[0xb] = -(pgVar2->m[0xb].n == uVar29);
            auVar32[0xc] = -(pgVar2->m[0xc].n == uVar25);
            auVar32[0xd] = -(pgVar2->m[0xd].n == uVar27);
            auVar32[0xe] = -(pgVar2->m[0xe].n == uVar28);
            auVar32[0xf] = -(pgVar2->m[0xf].n == uVar29);
            for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe); uVar17 != 0
                ; uVar17 = uVar17 - 1 & uVar17) {
              uVar7 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              if (puVar18[uVar11 * 0xf + (ulong)uVar7] == index) {
                puVar18 = puVar18 + uVar11 * 0xf + (ulong)uVar7;
                goto LAB_0044baed;
              }
            }
            if ((pgVar4[uVar11].m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) break;
            lVar12 = uVar11 + uVar23;
            uVar23 = uVar23 + 1;
            uVar11 = lVar12 + 1U & uVar16;
          } while (uVar23 <= uVar16);
          puVar18 = (value_type_pointer)0x0;
LAB_0044baed:
          if (puVar18 == (value_type_pointer)0x0) {
            if ((this->unreachableClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .size_ctrl.size <
                (this->unreachableClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
              ::nosize_unchecked_emplace_at<unsigned_int_const&>
                        (&res,(table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                               *)this,(arrays_type *)this,uVar22,uVar21,&index);
              psVar1 = &(this->unreachableClauses).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
              ::unchecked_emplace_with_rehash<unsigned_int_const&>
                        (&res,(table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                               *)this,uVar21,&index);
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != __n._M_extent_value);
    }
    local_b0 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.elements_;
    if (local_b0 != (value_type_pointer)0x0) {
      sVar15 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.groups_size_mask;
      pgVar5 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.groups_;
      if (pgVar5 != pgVar5 + sVar15 + 1) {
        local_70 = (this->overlappingClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   .size_ctrl.size;
        local_78 = (this->overlappingClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   .size_ctrl.ml;
        sVar6 = (this->unreachableClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                .arrays.groups_size_index;
        pgVar4 = (this->unreachableClauses).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_;
        pgVar10 = pgVar5;
        do {
          local_80 = pgVar10;
          auVar33[0] = -(local_80->m[0].n == '\0');
          auVar33[1] = -(local_80->m[1].n == '\0');
          auVar33[2] = -(local_80->m[2].n == '\0');
          auVar33[3] = -(local_80->m[3].n == '\0');
          auVar33[4] = -(local_80->m[4].n == '\0');
          auVar33[5] = -(local_80->m[5].n == '\0');
          auVar33[6] = -(local_80->m[6].n == '\0');
          auVar33[7] = -(local_80->m[7].n == '\0');
          auVar33[8] = -(local_80->m[8].n == '\0');
          auVar33[9] = -(local_80->m[9].n == '\0');
          auVar33[10] = -(local_80->m[10].n == '\0');
          auVar33[0xb] = -(local_80->m[0xb].n == '\0');
          auVar33[0xc] = -(local_80->m[0xc].n == '\0');
          auVar33[0xd] = -(local_80->m[0xd].n == '\0');
          auVar33[0xe] = -(local_80->m[0xe].n == '\0');
          auVar33[0xf] = -(local_80->m[0xf].n == '\0');
          for (uVar17 = ((uint)(pgVar5 + sVar15 != local_80) << 0xe | 0x3fff) &
                        ~(uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(auVar33[0xf] >> 7) << 0xf); uVar17 != 0;
              uVar17 = uVar17 - 1 & uVar17) {
            uVar7 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            auVar9 = ZEXT416(local_b0[uVar7].first) * ZEXT816(0x9e3779b97f4a7c15);
            uVar16 = auVar9._8_8_ ^ auVar9._0_8_;
            bVar13 = (byte)sVar6;
            uVar21 = uVar16 >> (bVar13 & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar16 & 0xff];
            uVar14 = (this->unreachableClauses).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     .arrays.groups_size_mask;
            puVar18 = (this->unreachableClauses).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      .arrays.elements_;
            uVar11 = 0;
            do {
              pgVar2 = pgVar4 + uVar21;
              uVar25 = (uchar)uVar3;
              auVar34[0] = -(pgVar2->m[0].n == uVar25);
              uVar27 = (uchar)((uint)uVar3 >> 8);
              auVar34[1] = -(pgVar2->m[1].n == uVar27);
              uVar28 = (uchar)((uint)uVar3 >> 0x10);
              auVar34[2] = -(pgVar2->m[2].n == uVar28);
              uVar29 = (uchar)((uint)uVar3 >> 0x18);
              auVar34[3] = -(pgVar2->m[3].n == uVar29);
              auVar34[4] = -(pgVar2->m[4].n == uVar25);
              auVar34[5] = -(pgVar2->m[5].n == uVar27);
              auVar34[6] = -(pgVar2->m[6].n == uVar28);
              auVar34[7] = -(pgVar2->m[7].n == uVar29);
              auVar34[8] = -(pgVar2->m[8].n == uVar25);
              auVar34[9] = -(pgVar2->m[9].n == uVar27);
              auVar34[10] = -(pgVar2->m[10].n == uVar28);
              auVar34[0xb] = -(pgVar2->m[0xb].n == uVar29);
              auVar34[0xc] = -(pgVar2->m[0xc].n == uVar25);
              auVar34[0xd] = -(pgVar2->m[0xd].n == uVar27);
              auVar34[0xe] = -(pgVar2->m[0xe].n == uVar28);
              auVar34[0xf] = -(pgVar2->m[0xf].n == uVar29);
              for (uVar24 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
                  uVar24 != 0; uVar24 = uVar24 - 1 & uVar24) {
                uVar8 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                if (local_b0[uVar7].first == puVar18[uVar21 * 0xf + (ulong)uVar8]) {
                  if (puVar18 + uVar21 * 0xf + (ulong)uVar8 != (value_type_pointer)0x0)
                  goto LAB_0044bd99;
                  goto LAB_0044bcbe;
                }
              }
              if ((pgVar4[uVar21].m[0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7]) == 0) break;
              lVar12 = uVar21 + uVar11;
              uVar11 = uVar11 + 1;
              uVar21 = lVar12 + 1U & uVar14;
            } while (uVar11 <= uVar14);
LAB_0044bcbe:
            auVar9 = ZEXT416(local_b0[uVar7].second) * ZEXT816(0x9e3779b97f4a7c15);
            uVar11 = auVar9._8_8_ ^ auVar9._0_8_;
            uVar16 = uVar11 >> (bVar13 & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar11 & 0xff];
            uVar14 = (this->unreachableClauses).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     .arrays.groups_size_mask;
            puVar18 = (this->unreachableClauses).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      .arrays.elements_;
            uVar21 = 0;
            do {
              pgVar2 = pgVar4 + uVar16;
              uVar25 = (uchar)uVar3;
              auVar35[0] = -(pgVar2->m[0].n == uVar25);
              uVar27 = (uchar)((uint)uVar3 >> 8);
              auVar35[1] = -(pgVar2->m[1].n == uVar27);
              uVar28 = (uchar)((uint)uVar3 >> 0x10);
              auVar35[2] = -(pgVar2->m[2].n == uVar28);
              uVar29 = (uchar)((uint)uVar3 >> 0x18);
              auVar35[3] = -(pgVar2->m[3].n == uVar29);
              auVar35[4] = -(pgVar2->m[4].n == uVar25);
              auVar35[5] = -(pgVar2->m[5].n == uVar27);
              auVar35[6] = -(pgVar2->m[6].n == uVar28);
              auVar35[7] = -(pgVar2->m[7].n == uVar29);
              auVar35[8] = -(pgVar2->m[8].n == uVar25);
              auVar35[9] = -(pgVar2->m[9].n == uVar27);
              auVar35[10] = -(pgVar2->m[10].n == uVar28);
              auVar35[0xb] = -(pgVar2->m[0xb].n == uVar29);
              auVar35[0xc] = -(pgVar2->m[0xc].n == uVar25);
              auVar35[0xd] = -(pgVar2->m[0xd].n == uVar27);
              auVar35[0xe] = -(pgVar2->m[0xe].n == uVar28);
              auVar35[0xf] = -(pgVar2->m[0xf].n == uVar29);
              for (uVar24 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
                  uVar24 != 0; uVar24 = uVar24 - 1 & uVar24) {
                uVar8 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                if (local_b0[uVar7].second == puVar18[uVar16 * 0xf + (ulong)uVar8]) {
                  if (puVar18 + uVar16 * 0xf + (ulong)uVar8 != (value_type_pointer)0x0) {
LAB_0044bd99:
                    local_78 = (local_78 - 1) +
                               (ulong)(((&boost::unordered::detail::foa::
                                          group15<boost::unordered::detail::foa::plain_integral>::
                                          is_not_overflowed(unsigned_long)::shift)
                                        [local_80->m[uVar7].n & 7] &
                                       *(byte *)((ulong)(local_80->m + uVar7) | 0xf)) == 0);
                    (this->overlappingClauses).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    .size_ctrl.ml = local_78;
                    local_80->m[uVar7].n = '\0';
                    local_70 = local_70 - 1;
                    (this->overlappingClauses).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    .size_ctrl.size = local_70;
                  }
                  goto LAB_0044bde5;
                }
              }
              if ((pgVar4[uVar16].m[0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
              lVar12 = uVar16 + uVar21;
              uVar21 = uVar21 + 1;
              uVar16 = lVar12 + 1U & uVar14;
            } while (uVar21 <= uVar14);
LAB_0044bde5:
          }
          local_b0 = local_b0 + 0xf;
          pgVar10 = local_80 + 1;
        } while (pgVar5 + sVar15 != local_80);
      }
    }
  }
  else {
    this->gaveUp = true;
  }
  if (((0x40 < start.super_SVIntStorage.bitWidth) ||
      ((start.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
     (start.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__(start.super_SVIntStorage.field_0.pVal);
  }
  if (activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)activeIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)activeIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

CaseDecisionDag::CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                                 uint32_t maxSteps) {
    SLANG_ASSERT(bitWidth > 0);

    std::vector<ClauseIndex> activeIndices(clauses.size());
    std::iota(activeIndices.begin(), activeIndices.end(), 0);

#if defined(SLANG_DEBUG)
    for (auto& clause : clauses)
        SLANG_ASSERT(clause.getBitWidth() == bitWidth);
#endif

    SVInt start(bitWidth, 0, false);
    build(0, clauses, bitWidth, wildcardX, maxSteps, start, std::move(activeIndices));

    if (steps >= maxSteps) {
        gaveUp = true;
        return;
    }

    // Any clauses not used are marked as redundant.
    for (size_t i = 0; i < clauses.size(); i++) {
        auto index = (ClauseIndex)i;
        if (usedIndices.find(index) == usedIndices.end())
            unreachableClauses.insert(index);
    }

    // Remove overlapping clauses that are fully unreachable.
    erase_if(overlappingClauses, [&](const auto& pair) {
        return unreachableClauses.contains(pair.first) || unreachableClauses.contains(pair.second);
    });
}